

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O2

void test_basic_learn(void)

{
  Dummy d;
  AutomationMgr local_a0;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  _Any_data __tmp;
  
  suite("test_basic_learn");
  rtosc::AutomationMgr::AutomationMgr(&local_a0,4,2,0x10);
  d.foo = 0.0;
  d.bar = 0.0;
  rtosc::AutomationMgr::set_ports(&local_a0,&p);
  rtosc::AutomationMgr::set_instance(&local_a0,&d);
  rtosc::AutomationMgr::createBinding(&local_a0,0,"/foo",false);
  local_28 = local_a0.backend.super__Function_base._M_manager;
  local_38._M_unused._M_object =
       local_a0.backend.super__Function_base._M_functor._M_unused._M_object;
  local_38._8_8_ = local_a0.backend.super__Function_base._M_functor._8_8_;
  local_a0.backend.super__Function_base._M_functor._8_8_ = 0;
  local_a0.backend.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/test/test-automation.cpp:115:19)>
       ::_M_manager;
  p_Stack_20 = local_a0.backend._M_invoker;
  local_a0.backend._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/test/test-automation.cpp:115:19)>
       ::_M_invoke;
  local_a0.backend.super__Function_base._M_functor._M_unused._M_object = &d;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  assert_str_eq("/foo",(local_a0.slots)->automations->param_path,"Parameter is learned",0x79);
  assert_flt_eq(0.0,d.foo,"Learning does not change values",0x7a);
  rtosc::AutomationMgr::setSlot(&local_a0,0,1.0);
  assert_flt_eq(10.0,d.foo,"Slot to max makes bound parameter max",0x7c);
  rtosc::AutomationMgr::setSlot(&local_a0,0,0.0);
  assert_flt_eq(-1.0,d.foo,"Slot to min makes bound parameter min",0x7e);
  rtosc::AutomationMgr::~AutomationMgr(&local_a0);
  return;
}

Assistant:

void test_basic_learn(void)
{
    suite("test_basic_learn");
    rtosc::AutomationMgr mgr(4, 2, 16);
    Dummy d = {0,0};
    mgr.set_ports(p);
    mgr.set_instance(&d);
    mgr.createBinding(0, "/foo", false);
    mgr.backend = [&d](const char *msg) {
        rtosc::RtData rd;
        char loc[128];
        rd.loc = loc;
        rd.loc_size = sizeof(loc);
        rd.obj = &d; p.dispatch(msg, rd, true);};
    assert_str_eq("/foo", mgr.slots[0].automations[0].param_path, "Parameter is learned", __LINE__);
    assert_flt_eq(0, d.foo, "Learning does not change values", __LINE__);
    mgr.setSlot(0, 1);
    assert_flt_eq(10, d.foo, "Slot to max makes bound parameter max", __LINE__);
    mgr.setSlot(0, 0);
    assert_flt_eq(-1, d.foo, "Slot to min makes bound parameter min", __LINE__);
}